

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O1

void __thiscall FunctionAnalyser::visit(FunctionAnalyser *this,FunctionSymbol *symbol)

{
  this->symbolValid_ = true;
  if (&this->arguments_ != &symbol->arguments_) {
    std::__cxx11::list<TypeName,std::allocator<TypeName>>::
    _M_assign_dispatch<std::_List_const_iterator<TypeName>>
              ((list<TypeName,std::allocator<TypeName>> *)&this->arguments_,
               (symbol->arguments_).super__List_base<TypeName,_std::allocator<TypeName>_>._M_impl.
               _M_node.super__List_node_base._M_next);
  }
  (this->returnType_).super__Optional_base<TypeName,_true,_true>._M_payload.
  super__Optional_payload_base<TypeName> =
       (_Optional_payload_base<TypeName>)((ulong)symbol->returnType_ | 0x100000000);
  return;
}

Assistant:

void FunctionAnalyser::visit(FunctionSymbol& symbol)
{
  symbolValid_ = true;
  arguments_ = symbol.getArguments();
  returnType_ = symbol.getReturnType();
}